

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns.c
# Opt level: O3

int dns_get_rcode(char *rsp,size_t len)

{
  char *pcVar1;
  uint uVar2;
  
  pcVar1 = dns_get_edns_opt(rsp,len);
  uVar2 = 0xffffffff;
  if (0xb < len && rsp != (char *)0x0) {
    if (pcVar1 == (char *)0x0) {
      uVar2 = (byte)rsp[3] & 0xf;
    }
    else {
      uVar2 = (byte)rsp[3] & 0xf | (uint)(byte)pcVar1[5] << 4;
    }
  }
  return uVar2;
}

Assistant:

int dns_get_rcode(const char * rsp, size_t len)
{
    struct dns_header_t * hdr = (struct dns_header_t *)rsp;
    const char * opt = dns_get_edns_opt(rsp, len);

    if (!rsp || len < sizeof(struct dns_header_t))
        return -1;

    if (opt) {
        // For response with ENDS OPT, extended bits of rcode need to be included.
        uint8_t rcode_msb = *(opt 
                                + 1                // NAME
                                + sizeof(uint16_t) // OPT
                                + sizeof(uint16_t) // CLASS
                              );
        return (rcode_msb << RCODE_BITS) | hdr->rcode;
    }
    else {
        return hdr->rcode;
    }
}